

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

void __thiscall Centaurus::CATNNode<char>::CATNNode(CATNNode<char> *this,Identifier *id)

{
  this->_vptr_CATNNode = (_func_int **)&PTR__CATNNode_0017e0e0;
  (this->m_transitions).
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_transitions).
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_transitions).
  super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Identifier::Identifier(&this->m_submachine,id);
  this->m_source = -1;
  return;
}

Assistant:

CATNNode(const Identifier& id)
        : m_submachine(id), m_source(-1)
    {
    }